

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitCurve(SemanticParser *this,SP *shape)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  bool bVar15;
  int iVar16;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  float fVar18;
  SP SVar19;
  SP ours;
  string basis;
  string type;
  string local_118;
  Curve *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  string local_e8;
  undefined1 local_c8 [32];
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> local_a8;
  SP local_90;
  size_t local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70;
  string local_50;
  
  local_80 = *(size_t *)(*in_RDX + 0x58);
  local_78 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x60);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_c8,(SP *)shape);
  local_f8 = (Curve *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Curve,std::allocator<pbrt::Curve>,std::shared_ptr<pbrt::Material>>
            (&_Stack_f0,&local_f8,(allocator<pbrt::Curve> *)&local_e8,
             (shared_ptr<pbrt::Material> *)local_c8);
  std::__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Curve,pbrt::Curve>
            ((__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2> *)&local_f8,local_f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  lVar2 = *in_RDX;
  uVar4 = *(undefined4 *)(lVar2 + 0x78);
  fVar18 = *(float *)(lVar2 + 0x7c);
  uVar5 = *(undefined4 *)(lVar2 + 0x80);
  fVar6 = *(float *)(lVar2 + 0x84);
  fVar7 = *(float *)(lVar2 + 0x88);
  fVar8 = *(float *)(lVar2 + 0x8c);
  fVar9 = *(float *)(lVar2 + 0x90);
  fVar10 = *(float *)(lVar2 + 0x94);
  fVar11 = *(float *)(lVar2 + 0x9c);
  fVar12 = *(float *)(lVar2 + 0xa0);
  fVar13 = *(float *)(lVar2 + 0xa4);
  (local_f8->transform).l.vz.z = *(float *)(lVar2 + 0x98);
  (local_f8->transform).p.x = fVar11;
  (local_f8->transform).p.y = fVar12;
  (local_f8->transform).p.z = fVar13;
  (local_f8->transform).l.vy.y = fVar7;
  (local_f8->transform).l.vy.z = fVar8;
  (local_f8->transform).l.vz.x = fVar9;
  (local_f8->transform).l.vz.y = fVar10;
  (local_f8->transform).l.vx.x = (float)uVar4;
  (local_f8->transform).l.vx.y = fVar18;
  *(undefined4 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_f8->transform).l.vx.z)->_M_pi = uVar5;
  (local_f8->transform).l.vy.x = fVar6;
  lVar2 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"type","");
  bVar15 = syntactic::ParamSet::hasParamString((ParamSet *)(lVar2 + 8),&local_e8);
  if (bVar15) {
    lVar2 = *in_RDX;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
    syntactic::ParamSet::getParamString((string *)local_c8,(ParamSet *)(lVar2 + 8),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  iVar16 = std::__cxx11::string::compare(local_c8);
  if (iVar16 == 0) {
    local_f8->type = CurveType_Cylinder;
  }
  else {
    iVar16 = std::__cxx11::string::compare(local_c8);
    if (iVar16 == 0) {
      local_f8->type = CurveType_Ribbon;
    }
    else {
      iVar16 = std::__cxx11::string::compare(local_c8);
      if (iVar16 == 0) {
        local_f8->type = CurveType_Flat;
      }
      else {
        local_f8->type = CurveType_Unknown;
      }
    }
  }
  lVar2 = *in_RDX;
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"basis","");
  bVar15 = syntactic::ParamSet::hasParamString((ParamSet *)(lVar2 + 8),&local_118);
  if (bVar15) {
    lVar2 = *in_RDX;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"basis","");
    syntactic::ParamSet::getParamString(&local_e8,(ParamSet *)(lVar2 + 8),&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_e8);
  if (iVar16 == 0) {
    local_f8->basis = CurveBasis_Bezier;
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)&local_e8);
    if (iVar16 == 0) {
      local_f8->basis = CurveBasis_BSpline;
    }
    else {
      local_f8->basis = CurveBasis_Unknown;
    }
  }
  lVar2 = *in_RDX;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width","");
  bVar15 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar15) {
    lVar2 = *in_RDX;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width","");
    fVar18 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_118,0.0);
    local_f8->width1 = fVar18;
    local_f8->width0 = fVar18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  lVar2 = *in_RDX;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width0","");
  bVar15 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar15) {
    lVar2 = *in_RDX;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width0","");
    fVar18 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_118,0.0);
    local_f8->width0 = fVar18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  lVar2 = *in_RDX;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width1","");
  bVar15 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar15) {
    lVar2 = *in_RDX;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"width1","");
    fVar18 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_118,0.0);
    local_f8->width1 = fVar18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  lVar2 = *in_RDX;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"degree","");
  bVar15 = syntactic::ParamSet::hasParam1i((ParamSet *)(lVar2 + 8),&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar15) {
    lVar2 = *in_RDX;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"degree","");
    iVar16 = syntactic::ParamSet::getParam1i((ParamSet *)(lVar2 + 8),&local_118,0);
    local_f8->degree = (uint8_t)iVar16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"P","");
  extractVector<pbrt::math::vec3f>(&local_a8,(SemanticParser *)shape,&local_90,&local_118);
  pvVar3 = (local_f8->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (local_f8->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_f8->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_f8->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var17._M_pi = extraout_RDX;
  if (pvVar3 != (pointer)0x0) {
    operator_delete(pvVar3);
    _Var17._M_pi = extraout_RDX_00;
  }
  if (local_a8.super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    _Var17._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
    _Var17._M_pi = extraout_RDX_02;
  }
  if ((_Base_ptr)
      local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var17._M_pi = extraout_RDX_03;
  }
  _Var14._M_pi = _Stack_f0._M_pi;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  local_f8 = (Curve *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
    _Var17._M_pi = extraout_RDX_04;
  }
  if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_);
    _Var17._M_pi = extraout_RDX_05;
  }
  if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
    _Var17._M_pi = extraout_RDX_06;
  }
  SVar19.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var17._M_pi;
  SVar19.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar19.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitCurve(pbrt::syntactic::Shape::SP shape)
  {
    Curve::SP ours = std::make_shared<Curve>(findOrCreateMaterial(shape->material));
    ours->transform = shape->transform.atStart;
    // -------------------------------------------------------
    // check 'type'
    // -------------------------------------------------------
    const std::string type
      = shape->hasParamString("type")
      ? shape->getParamString("type")
      : std::string("");
    if (type == "cylinder")
      ours->type = Curve::CurveType_Cylinder;
    else if (type == "ribbon")
      ours->type = Curve::CurveType_Ribbon;
    else if (type == "flat")
      ours->type = Curve::CurveType_Flat;
    else 
      ours->type = Curve::CurveType_Unknown;
        
    // -------------------------------------------------------
    // check 'basis'
    // -------------------------------------------------------
    const std::string basis
      = shape->hasParamString("basis")
      ? shape->getParamString("basis")
      : std::string("");
    if (basis == "bezier")
      ours->basis = Curve::CurveBasis_Bezier;
    else if (basis == "bspline")
      ours->basis = Curve::CurveBasis_BSpline;
    else 
      ours->basis = Curve::CurveBasis_Unknown;
        
    // -------------------------------------------------------
    // check 'width', 'width0', 'width1'
    // -------------------------------------------------------
    if (shape->hasParam1f("width")) 
      ours->width0 = ours->width1 = shape->getParam1f("width");
        
    if (shape->hasParam1f("width0")) 
      ours->width0 = shape->getParam1f("width0");
    if (shape->hasParam1f("width1")) 
      ours->width1 = shape->getParam1f("width1");

    if (shape->hasParam1i("degree")) 
      ours->degree = shape->getParam1i("degree");

    // -------------------------------------------------------
    // vertices - param "P", 3x float each
    // -------------------------------------------------------
    ours->P = extractVector<vec3f>(shape,"P");
    return ours;
  }